

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O2

LogStream * __thiscall muduo::LogStream::operator<<(LogStream *this,void *p)

{
  char **ppcVar1;
  char *pcVar2;
  size_t sVar3;
  
  ppcVar1 = &(this->buffer_).cur_;
  pcVar2 = (this->buffer_).cur_;
  if (0x1f < (int)ppcVar1 - (int)pcVar2) {
    pcVar2[0] = '0';
    pcVar2[1] = 'x';
    sVar3 = detail::convertHex(pcVar2 + 2,(uintptr_t)p);
    *ppcVar1 = *ppcVar1 + sVar3 + 2;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(const void* p)
{
  uintptr_t v = reinterpret_cast<uintptr_t>(p);
  if (buffer_.avail() >= kMaxNumericSize)
  {
    char* buf = buffer_.current();
    buf[0] = '0';
    buf[1] = 'x';
    size_t len = convertHex(buf+2, v);
    buffer_.add(len+2);
  }
  return *this;
}